

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<128U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator*=
          (uintwide_t<128U,_unsigned_int,_void,_true> *this,
          uintwide_t<128U,_unsigned_int,_void,_true> *other)

{
  uintwide_t<128U,_unsigned_int,_void,_true> other_as_self_copy;
  undefined8 local_38;
  undefined8 uStack_30;
  uintwide_t<128U,_unsigned_int,_void,_true> local_28;
  
  if (this == other) {
    local_28.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
         *(undefined8 *)(other->values).super_array<unsigned_int,_4UL>.elems;
    local_28.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_4UL>.elems + 2);
    other = &local_28;
  }
  local_38 = 0;
  uStack_30 = 0;
  eval_multiply_n_by_n_to_lo_part<unsigned_int_*,_const_unsigned_int_*,_const_unsigned_int_*,_128U,_nullptr>
            ((uint *)&local_38,(uint *)this,(uint *)other,4);
  *(undefined8 *)(this->values).super_array<unsigned_int,_4UL>.elems = local_38;
  *(undefined8 *)((this->values).super_array<unsigned_int,_4UL>.elems + 2) = uStack_30;
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }